

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::dht_stats_alert::~dht_stats_alert(dht_stats_alert *this)

{
  ::std::
  _Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>::
  ~_Vector_base(&(this->routing_table).
                 super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
               );
  ::std::_Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>::
  ~_Vector_base(&(this->active_requests).
                 super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>
               );
  return;
}

Assistant:

struct TORRENT_EXPORT dht_stats_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT dht_stats_alert(aux::stack_allocator& alloc
			, std::vector<dht_routing_bucket> table
			, std::vector<dht_lookup> requests
			, sha1_hash id, udp::endpoint ep);

		TORRENT_DEFINE_ALERT(dht_stats_alert, 83)

		static inline constexpr alert_category_t static_category = {};
		std::string message() const override;

		// a vector of the currently running DHT lookups.
		std::vector<dht_lookup> active_requests;

		// contains information about every bucket in the DHT routing
		// table.
		std::vector<dht_routing_bucket> routing_table;

		// the node ID of the DHT node instance
		sha1_hash nid;

		// the local socket this DHT node is running on
		aux::noexcept_movable<udp::endpoint> local_endpoint;
	}